

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O0

void __thiscall
license::locate::ExternalDefinition::ExternalDefinition
          (ExternalDefinition *this,LicenseLocation *location)

{
  allocator local_39;
  string local_38;
  LicenseLocation *local_18;
  LicenseLocation *location_local;
  ExternalDefinition *this_local;
  
  local_18 = location;
  location_local = (LicenseLocation *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"ExternalDefinition",&local_39);
  LocatorStrategy::LocatorStrategy(&this->super_LocatorStrategy,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__005c7f38;
  this->m_location = local_18;
  return;
}

Assistant:

ExternalDefinition::ExternalDefinition(const LicenseLocation *location)
	: LocatorStrategy("ExternalDefinition"), m_location(location) {}